

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O0

bool __thiscall
SqModules::compileScript
          (SqModules *this,vector<char,_std::allocator<char>_> *buf,char *resolved_fn,
          char *requested_fn,HSQOBJECT *bindings,Object *script_closure,string *out_err_msg,
          SqASTData **return_ast)

{
  bool bVar1;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000008;
  char *r;
  char buffer [4096];
  char *filePath;
  char *in_stack_ffffffffffffeee8;
  Object *ptr;
  HSQUIRRELVM in_stack_ffffffffffffeef0;
  char *__rhs;
  Object local_1100;
  allocator<char> *in_stack_ffffffffffffef20;
  char *in_stack_ffffffffffffef28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef30;
  SQInteger in_stack_ffffffffffffef40;
  HSQUIRRELVM in_stack_ffffffffffffef48;
  Var<Sqrat::Object> *in_stack_ffffffffffffef50;
  SqASTData **in_stack_ffffffffffffef68;
  HSQOBJECT *in_stack_ffffffffffffef70;
  char *in_stack_ffffffffffffef78;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffef80;
  SqModules *in_stack_ffffffffffffef88;
  string local_1070 [32];
  char *local_1050;
  undefined1 local_1048 [4104];
  char *local_40;
  char *local_20;
  
  local_20 = in_RDX;
  Sqrat::Object::Release((Object *)in_stack_ffffffffffffeef0);
  local_40 = local_20;
  memset(local_1048,0,0x1000);
  if (((in_RDI->field_0x3 & 1) != 0) &&
     (local_1050 = computeAbsolutePath((char *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,
                                       0x1d916a), local_1050 != (char *)0x0)) {
    local_40 = local_1050;
  }
  bVar1 = compileScriptImpl(in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
                            in_stack_ffffffffffffef78,in_stack_ffffffffffffef70,
                            in_stack_ffffffffffffef68);
  if (bVar1) {
    ptr = &local_1100;
    Sqrat::Var<Sqrat::Object>::Var
              (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
    Sqrat::Object::operator=((Object *)in_stack_ffffffffffffeef0,ptr);
    Sqrat::Var<Sqrat::Object>::~Var((Var<Sqrat::Object> *)0x1d9341);
    sq_pop(in_stack_ffffffffffffeef0,(SQInteger)ptr);
  }
  else {
    __rhs = &stack0xffffffffffffef2f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,in_stack_ffffffffffffef20);
    std::operator+(in_RDI,__rhs);
    std::operator+(in_RDI,__rhs);
    std::operator+(in_RDI,__rhs);
    std::__cxx11::string::operator=(in_stack_00000008,local_1070);
    std::__cxx11::string::~string(local_1070);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffef70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffef50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffef30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffef2f);
  }
  return bVar1;
}

Assistant:

bool SqModules::compileScript(const std::vector<char> &buf, const char *resolved_fn, const char *requested_fn,
                                                        const HSQOBJECT *bindings,
                                                        Sqrat::Object &script_closure, string &out_err_msg,
                                                        SQCompilation::SqASTData **return_ast)
{
  script_closure.Release();

  const char *filePath = resolved_fn;
  char buffer[MAX_PATH_LENGTH] = {0};

  if (compilationOptions.useAbsolutePath) {
    const char *r = computeAbsolutePath(resolved_fn, buffer, MAX_PATH_LENGTH);
    if (r)
      filePath = r;
  }

  if (!compileScriptImpl(buf, filePath, bindings, return_ast))
  {
    out_err_msg = string("Failed to compile file: ") + requested_fn + " / " + resolved_fn;
    return false;
  }

  script_closure = Sqrat::Var<Sqrat::Object>(sqvm, -1).value;
  sq_pop(sqvm, 1);

  return true;
}